

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_info_fwd.hpp
# Opt level: O3

void __thiscall
toml::error_info::error_info(error_info *this,string *t,source_location *l,string *m,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  allocator_type local_b9;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  
  paVar1 = &(this->title_).field_2;
  (this->title_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (t->_M_dataplus)._M_p;
  paVar2 = &t->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&t->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->title_).field_2 + 8) = uVar4;
  }
  else {
    (this->title_)._M_dataplus._M_p = pcVar3;
    (this->title_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->title_)._M_string_length = t->_M_string_length;
  (t->_M_dataplus)._M_p = (pointer)paVar2;
  t->_M_string_length = 0;
  (t->field_2)._M_local_buf[0] = '\0';
  std::
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_b8,l,m);
  __l._M_len = 1;
  __l._M_array = &local_b8;
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->locations_,__l,&local_b9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.second._M_dataplus._M_p != &local_b8.second.field_2) {
    operator_delete(local_b8.second._M_dataplus._M_p,
                    local_b8.second.field_2._M_allocated_capacity + 1);
  }
  source_location::~source_location(&local_b8.first);
  paVar1 = &(this->suffix_).field_2;
  (this->suffix_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (s->_M_dataplus)._M_p;
  paVar2 = &s->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&s->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->suffix_).field_2 + 8) = uVar4;
  }
  else {
    (this->suffix_)._M_dataplus._M_p = pcVar3;
    (this->suffix_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->suffix_)._M_string_length = s->_M_string_length;
  (s->_M_dataplus)._M_p = (pointer)paVar2;
  s->_M_string_length = 0;
  (s->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

error_info(std::string t, source_location l, std::string m, std::string s = "")
        : title_(std::move(t)), locations_{std::make_pair(std::move(l), std::move(m))},
          suffix_(std::move(s))
    {}